

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageOutputTest.cpp
# Opt level: O3

void __thiscall
imageOutput_drawBoundary_Test::~imageOutput_drawBoundary_Test(imageOutput_drawBoundary_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(imageOutput, drawBoundary) {
  /// Instantiate objects for various classes
  ImageOutput imageOutput;
  ReaderWriterMock* writerMock = new ReaderWriterMock();
  /// Set mock to manipulate images
  imageOutput.setWriter(writerMock);
  /// Read image from file directory
  cv::Mat sampleImage = cv::imread("1_Human.jpg", 1);
  /// Define a constant rectangle for testing
  cv::Rect r1(414, 0, 321, 642);
  std::vector<cv::Rect> detectedMock;
  detectedMock.push_back(r1);
  /// Add mock implementation to draw boundary on image
  cv::Mat z = cv::Mat::zeros(720, 1280, CV_8U);
  EXPECT_CALL(*writerMock, drawRectangle(_, _)).WillRepeatedly(
    Return(z));
  /// Evaluate difference between the images
  cv::Mat diff = sampleImage
      != imageOutput.drawBoundary(sampleImage, detectedMock);
  /// There should be no difference in the images generated by both methods
  bool eq = cv::countNonZero(diff) == 0;
  EXPECT_EQ(true, eq);
  /// delete mock object
  delete writerMock;
}